

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_std.h
# Opt level: O0

double mp::ComputeValue<mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
                 (QuadraticObjective *obj,
                 VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *x)

{
  bool bVar1;
  VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *in_RSI;
  QuadraticObjective *in_RDI;
  longdouble in_ST0;
  longdouble in_ST1;
  double nlp;
  double qp;
  double linp;
  VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *in_stack_000000a8;
  LinTerms *in_stack_000000b0;
  int in_stack_ffffffffffffffbc;
  undefined8 local_38;
  
  LinearObjective::GetLinTerms((LinearObjective *)in_RDI);
  LinTerms::ComputeValue<mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
            (in_stack_000000b0,in_stack_000000a8);
  QuadraticObjective::GetQPTerms(in_RDI);
  QuadTerms::ComputeValue<mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
            ((QuadTerms *)linp,(VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *)qp);
  bVar1 = NLObjective::HasExpr(&in_RDI->super_NLObjective);
  if (bVar1) {
    NLObjective::ExprIndex(&in_RDI->super_NLObjective);
    local_38 = VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::operator[]
                         (in_RSI,in_stack_ffffffffffffffbc);
  }
  else {
    local_38 = 0.0;
  }
  return (double)in_ST0 + (double)in_ST1 + local_38;
}

Assistant:

double ComputeValue(
    const QuadraticObjective& obj, const VarVec& x) {
  double linp = obj.GetLinTerms().ComputeValue(x);
  double qp = obj.GetQPTerms().ComputeValue(x);
  double nlp = (obj.HasExpr() ? x[obj.ExprIndex()] : 0.0);
  return linp + qp + nlp;
}